

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O1

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,FunctionBody *func_body,void *data)

{
  uint uVar1;
  SyntaxTree *pSVar2;
  int iVar3;
  int iVar4;
  String *name;
  uint register_id;
  Guard g_1;
  Guard g;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  Guard local_48;
  
  local_88._8_8_ = 0;
  pcStack_70 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1438:13)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1438:13)>
             ::_M_manager;
  local_a8._8_8_ = 0;
  pcStack_90 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1438:13)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1438:13)>
             ::_M_manager;
  local_a8._M_unused._M_object = this;
  local_88._M_unused._M_object = this;
  Guard::Guard(&local_48,(function<void_()> *)&local_88,(function<void_()> *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  Function::SetLine(this->current_function_->function_,func_body->line_);
  iVar3 = this->current_function_->func_index_;
  local_a8._8_8_ = 0;
  pcStack_90 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1444:17)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1444:17)>
             ::_M_manager;
  local_68._8_8_ = 0;
  pcStack_50 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1444:17)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1444:17)>
             ::_M_manager;
  local_a8._M_unused._M_object = this;
  local_68._M_unused._M_object = this;
  Guard::Guard((Guard *)&local_88,(function<void_()> *)&local_a8,(function<void_()> *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  if (func_body->has_self_ == true) {
    iVar4 = GenerateRegisterId(this);
    name = State::GetString(this->state_,"self");
    InsertName(this,name,iVar4);
    Function::AddFixedArgCount(this->current_function_->function_,1);
  }
  pSVar2 = (func_body->param_list_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  if (pSVar2 != (SyntaxTree *)0x0) {
    (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,this,0);
  }
  pSVar2 = (func_body->block_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,this,0);
  Guard::~Guard((Guard *)&local_88);
  Guard::~Guard(&local_48);
  uVar1 = *data;
  iVar4 = *(int *)((long)data + 4);
  register_id = uVar1;
  if ((int)uVar1 < iVar4 || iVar4 == -1) {
    register_id = uVar1 + 1;
    Function::AddInstruction
              (this->current_function_->function_,
               (Instruction)((uint)(ushort)iVar3 + (uVar1 & 0xff) * 0x10000 + 0xb000000),
               func_body->line_);
  }
  FillRemainRegisterNil(this,register_id,iVar4,func_body->line_);
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(FunctionBody *func_body, void *data)
    {
        int child_index = 0;
        {
            CODE_GENERATE_GUARD(EnterFunction, LeaveFunction);
            auto function = GetCurrentFunction();
            function->SetLine(func_body->line_);
            child_index = current_function_->func_index_;

            {
                CODE_GENERATE_GUARD(EnterBlock, LeaveBlock);
                // Child function generate code
                if (func_body->has_self_)
                {
                    auto register_id = GenerateRegisterId();
                    auto self = state_->GetString("self");
                    InsertName(self, register_id);

                    auto function = GetCurrentFunction();
                    function->AddFixedArgCount(1);
                }

                if (func_body->param_list_)
                    func_body->param_list_->Accept(this, nullptr);
                func_body->block_->Accept(this, nullptr);
            }
        }

        // Generate closure
        auto exp_var_data = static_cast<ExpVarData *>(data);
        auto register_id = exp_var_data->start_register_;
        auto end_register = exp_var_data->end_register_;
        if (end_register == EXP_VALUE_COUNT_ANY || register_id < end_register)
        {
            auto function = GetCurrentFunction();
            auto i = Instruction::ABxCode(OpType_Closure,
                                          register_id++,
                                          child_index);
            function->AddInstruction(i, func_body->line_);
        }

        FillRemainRegisterNil(register_id, end_register, func_body->line_);
    }